

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O2

int nn_xbus_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  nn_pipe *pipe;
  
  while( true ) {
    iVar1 = nn_fq_recv((nn_fq *)&self[2].sock,msg,&pipe);
    if (iVar1 < 0) {
      return iVar1;
    }
    sVar2 = nn_chunkref_size(&msg->sphdr);
    if (sVar2 == 0) break;
    nn_msg_term(msg);
  }
  nn_chunkref_term(&msg->sphdr);
  nn_chunkref_init(&msg->sphdr,8);
  puVar3 = (undefined8 *)nn_chunkref_data(&msg->sphdr);
  *puVar3 = 0;
  puVar3 = (undefined8 *)nn_chunkref_data(&msg->sphdr);
  *puVar3 = pipe;
  return 0;
}

Assistant:

int nn_xbus_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xbus *xbus;
    struct nn_pipe *pipe;

    xbus = nn_cont (self, struct nn_xbus, sockbase);

    while (1) {

        /*  Get next message in fair-queued manner. */
        rc = nn_fq_recv (&xbus->inpipes, msg, &pipe);
        if (nn_slow (rc < 0))
            return rc;

        /*  The message should have no header. Drop malformed messages. */
        if (nn_chunkref_size (&msg->sphdr) == 0)
            break;
        nn_msg_term (msg);
    }

    /*  Add pipe ID to the message header. */
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, sizeof (uint64_t));
    memset (nn_chunkref_data (&msg->sphdr), 0, sizeof (uint64_t));
    memcpy (nn_chunkref_data (&msg->sphdr), &pipe, sizeof (pipe));

    return 0;
}